

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::execCallbackProcessing(FederateState *this,IterationResult result)

{
  int iVar1;
  GlobalFederateId GVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  IterationRequest extraout_DL;
  undefined1 in_SIL;
  FederateState *in_RDI;
  ActionMessage bye;
  ActionMessage bye_1;
  ActionMessage treq;
  pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> execIter;
  undefined7 in_stack_fffffffffffffd48;
  IterationRequest in_stack_fffffffffffffd4f;
  BrokerBase *in_stack_fffffffffffffd50;
  BrokerBase *this_00;
  action_t startingAction;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined1 local_1c8 [216];
  BaseType local_f0;
  BaseType local_e8;
  __native_type local_d8 [3];
  _Elt_pointer local_40;
  _Elt_pointer local_30;
  uint local_28;
  _Elt_pointer local_20;
  IterationRequest local_18;
  undefined1 local_9;
  
  local_9 = in_SIL;
  peVar3 = std::
           __shared_ptr_access<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4eb442);
  local_30 = (_Elt_pointer)grantedTime(in_RDI);
  local_28 = CONCAT31(local_28._1_3_,local_9);
  iVar1 = (*peVar3->_vptr_FederateOperator[3])(peVar3,local_30,(ulong)local_28);
  local_40 = (_Elt_pointer)CONCAT44(extraout_var,iVar1);
  uVar4 = CONCAT13(extraout_DL,(int3)in_stack_fffffffffffffd70);
  startingAction = (action_t)((ulong)peVar3 >> 0x20);
  local_20 = local_40;
  local_18 = extraout_DL;
  if (ITERATE_IF_NEEDED < extraout_DL) {
    if (extraout_DL == HALT_OPERATIONS) {
      this_00 = (BrokerBase *)local_1c8;
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffd74,uVar4),startingAction);
      local_1c8._8_4_ = std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
      local_1c8._16_4_ = local_1c8._8_4_;
      BrokerBase::addActionMessage
                (this_00,(ActionMessage *)
                         CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      ActionMessage::~ActionMessage((ActionMessage *)this_00);
      goto LAB_004eb6f8;
    }
    if (extraout_DL == ERROR_CONDITION) {
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffd74,uVar4),startingAction);
      GVar2 = std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
      SmallBuffer::operator=
                ((SmallBuffer *)CONCAT44(0xffffffe3,in_stack_fffffffffffffd78),
                 (char (*) [68])CONCAT44(GVar2.gid,uVar4));
      BrokerBase::addActionMessage
                (in_stack_fffffffffffffd50,
                 (ActionMessage *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd50);
      goto LAB_004eb6f8;
    }
  }
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffd74,uVar4),startingAction);
  local_1c8._204_4_ = std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
  local_d8[0].__align = local_20;
  local_f0 = local_1c8._204_4_;
  local_e8 = local_1c8._204_4_;
  setIterationFlags((ActionMessage *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4f);
  setActionFlag<helics::ActionMessage,helics::GeneralFlags>
            ((ActionMessage *)(local_1c8 + 0xd0),indicator_flag);
  BrokerBase::addActionMessage
            (in_stack_fffffffffffffd50,
             (ActionMessage *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd50);
LAB_004eb6f8:
  in_RDI->lastIterationRequest = local_18;
  return;
}

Assistant:

void FederateState::execCallbackProcessing(IterationResult result)
{
    auto execIter = fedCallbacks->operate({grantedTime(), result});
    switch (execIter.second) {
        case IterationRequest::NO_ITERATIONS:
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
        default: {
            ActionMessage treq(CMD_TIME_REQUEST);
            treq.source_id = global_id.load();
            treq.dest_id = treq.source_id;
            treq.actionTime = execIter.first;
            setIterationFlags(treq, execIter.second);
            setActionFlag(treq, indicator_flag);
            mParent->addActionMessage(treq);
        } break;
        case IterationRequest::HALT_OPERATIONS: {
            ActionMessage bye(CMD_DISCONNECT);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            mParent->addActionMessage(bye);
        } break;
        case IterationRequest::ERROR_CONDITION:
            ActionMessage bye(CMD_LOCAL_ERROR);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            bye.messageID = HELICS_USER_EXCEPTION;
            bye.payload = "Callback federate unspecified error condition in executing callback";
            mParent->addActionMessage(bye);
            break;
    }
    lastIterationRequest = execIter.second;
}